

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NC.hpp
# Opt level: O3

long __thiscall njoy::ENDFtk::section::Type<12>::Multiplicities::NC(Multiplicities *this)

{
  long lVar1;
  PartialMultiplicity *entry;
  pointer pPVar2;
  
  if ((this->total_).
      super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>.
      _M_payload.
      super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
      .super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>._M_engaged
      == true) {
    lVar1 = (((long)*(pointer *)
                     ((long)&(this->total_).
                             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>
                             ._M_payload.
                             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
                             .
                             super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>
                             ._M_payload._M_value.super_TabulationRecord + 0x38) -
              *(long *)((long)&(this->total_).
                               super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>
                               ._M_payload.
                               super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
                               .
                               super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>
                               ._M_payload + 0x30) >> 3) + 2) / 3 +
            (((long)*(pointer *)
                     ((long)&(this->total_).
                             super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>
                             ._M_payload.
                             super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
                             .
                             super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>
                             ._M_payload._M_value.super_TabulationRecord + 0x68) -
              *(long *)((long)&(this->total_).
                               super__Optional_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_false,_false>
                               ._M_payload.
                               super__Optional_payload<njoy::ENDFtk::section::Type<12>::TotalMultiplicity,_true,_false,_false>
                               .
                               super__Optional_payload_base<njoy::ENDFtk::section::Type<12>::TotalMultiplicity>
                               ._M_payload + 0x60) >> 3) + 2) / 3 + 1;
  }
  else {
    lVar1 = 0;
  }
  for (pPVar2 = (this->partials_).
                super__Vector_base<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pPVar2 != (this->partials_).
                super__Vector_base<njoy::ENDFtk::section::Type<12>::PartialMultiplicity,_std::allocator<njoy::ENDFtk::section::Type<12>::PartialMultiplicity>_>
                ._M_impl.super__Vector_impl_data._M_finish; pPVar2 = pPVar2 + 1) {
    lVar1 = lVar1 + (((long)(pPVar2->super_TabulationRecord).super_InterpolationBase.boundaryIndices
                            .super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(pPVar2->super_TabulationRecord).super_InterpolationBase.boundaryIndices
                            .super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3) + 2) / 3 +
            (((long)(pPVar2->super_TabulationRecord).xValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pPVar2->super_TabulationRecord).xValues.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) + 2) / 3 + 1;
  }
  return lVar1;
}

Assistant:

long NC() const {
  long NC = 0;
  if ( this->total_ ) { NC += this->total_->NC(); }
  for ( const auto& entry : this->partials_ ) {

    NC += entry.NC();
  }
  return NC;
}